

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::loop
          (TestMoreStuffImpl *this,uint depth,Client *cap,ExpectCancelContext context)

{
  pointer_____offset_0x10___ puVar1;
  PromiseNode *pPVar2;
  long *plVar3;
  TransformPromiseNodeBase *this_00;
  ImmediatePromiseNode<kj::_::Void> *pIVar4;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_00;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_01;
  undefined4 in_register_00000034;
  Disposer *in_R8;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar5;
  Own<kj::_::ChainPromiseNode> OVar6;
  Promise<void> PVar7;
  Own<kj::_::PromiseNode> local_80;
  Own<kj::_::PromiseNode> local_70;
  undefined1 local_60 [24];
  pointer_____offset_0x10___ *local_48;
  long *local_40;
  Disposer *local_38;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  if ((uint)cap < 0x65) {
    local_60._8_4_ = (uint)cap;
    local_60._0_8_ = (_func_int **)CONCAT44(in_register_00000034,depth);
    (**(code **)(**(long **)((context.hook)->_vptr_CallContextHook[-3] +
                            (long)&context.hook[1]._vptr_CallContextHook) + 0x20))(&local_48);
    local_60._16_8_ = &Capability::Client::typeinfo;
    local_38 = in_R8;
    kj::_::yield();
    this_00 = (TransformPromiseNodeBase *)operator_new(0x58);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_80,
               kj::_::
               TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++:1118:26),_kj::_::PropagateException>
               ::anon_class_48_4_ba8e04f4_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00635ef8;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_60._0_8_;
    *(undefined4 *)&this_00[1].dependency.disposer = local_60._8_4_;
    puVar1 = *(pointer_____offset_0x10___ *)(local_60._16_8_ + -0x18);
    this_00[1].continuationTracePtr = *(void **)(puVar1 + (long)(local_60 + 0x10));
    this_00[2].super_PromiseNode._vptr_PromiseNode = *(_func_int ***)(puVar1 + (long)&local_48);
    *(undefined8 *)(puVar1 + (long)&local_48) = 0;
    this_00[1].dependency.ptr = (PromiseNode *)&Capability::Client::typeinfo;
    this_00[2].dependency.disposer = local_38;
    local_70.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,capnp::_::TestMoreStuffImpl::loop(unsigned_int,capnproto_test::capnp::test::TestInterface::Client,capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>)::$_0,kj::_::PropagateException>>
          ::instance;
    local_70.ptr = (PromiseNode *)this_00;
    OVar6 = kj::heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_30,&local_70)
    ;
    pPVar2 = local_70.ptr;
    pIVar4 = (ImmediatePromiseNode<kj::_::Void> *)OVar6.ptr;
    *(undefined4 *)&this->super_Server = local_30;
    *(undefined4 *)&(this->super_Server).field_0x4 = uStack_2c;
    *(undefined4 *)&(this->super_Server).field_0x8 = uStack_28;
    *(undefined4 *)&(this->super_Server).field_0xc = uStack_24;
    if ((TransformPromiseNodeBase *)local_70.ptr != (TransformPromiseNodeBase *)0x0) {
      local_70.ptr = (PromiseNode *)0x0;
      (**(local_70.disposer)->_vptr_Disposer)
                (local_70.disposer,
                 ((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar2->_vptr_PromiseNode)->_vptr_PromiseNode);
      pIVar4 = extraout_RDX;
    }
    pPVar2 = local_80.ptr;
    if (local_80.ptr != (PromiseNode *)0x0) {
      local_80.ptr = (PromiseNode *)0x0;
      (**(local_80.disposer)->_vptr_Disposer)
                (local_80.disposer,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode)
      ;
      pIVar4 = extraout_RDX_00;
    }
    plVar3 = local_40;
    if (local_40 != (long *)0x0) {
      local_40 = (long *)0x0;
      (**(code **)*local_48)(local_48,(long)plVar3 + *(long *)(*plVar3 + -0x10));
      pIVar4 = extraout_RDX_01;
    }
  }
  else {
    local_60._8_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
    ;
    local_60._16_4_ = 0x45b;
    local_60[0] = true;
    kj::_::Debug::log<char_const(&)[19],char_const(&)[28]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x45b,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [28])"Looped too long, giving up.");
    kj::AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_60);
    OVar5 = kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)local_60);
    pIVar4 = OVar5.ptr;
    *(undefined8 *)&this->super_Server = local_60._0_8_;
    *(undefined8 *)&(this->super_Server).field_0x8 = local_60._8_8_;
  }
  PVar7.super_PromiseBase.node.ptr = (PromiseNode *)pIVar4;
  PVar7.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar7.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::loop(uint depth, test::TestInterface::Client cap,
                                          ExpectCancelContext context) {
  if (depth > 100) {
    ADD_FAILURE() << "Looped too long, giving up.";
    return kj::READY_NOW;
  } else {
    return kj::evalLater([this,depth,KJ_CPCAP(cap),KJ_CPCAP(context)]() mutable {
      return loop(depth + 1, cap, context);
    });
  }